

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  result rVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  decimal_fp<float> dVar5;
  uint uVar6;
  ulong uVar7;
  size_t __len;
  size_t sVar8;
  uint64_t error;
  decimal_fp<double> dVar9;
  fixed_handler handler;
  int local_68;
  float local_64;
  fixed_handler local_60;
  double local_48;
  longdouble local_3c;
  
  uVar7 = (ulong)specs & 0xff00000000;
  local_60.fixed = uVar7 == 0x200000000;
  if (value <= (longdouble)0) {
    if (precision < 1 || uVar7 != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar8 = buf->size_;
      buf->size_ = sVar8 + 1;
      buf->ptr_[sVar8] = '0';
      local_68 = 0;
    }
    else {
      uVar7 = (ulong)(uint)precision;
      if (buf->capacity_ < uVar7) {
        (**buf->_vptr_buffer)(buf,uVar7);
      }
      uVar3 = buf->capacity_;
      if (uVar7 <= buf->capacity_) {
        uVar3 = uVar7;
      }
      buf->size_ = uVar3;
      memset(buf->ptr_,0x30,uVar7);
      local_68 = -precision;
    }
  }
  else {
    uVar6 = specs._4_4_;
    if ((uVar6 >> 0x13 & 1) == 0) {
      local_68 = snprintf_float<long_double>(value,precision,specs,buf);
    }
    else if (precision < 0) {
      if ((uVar6 >> 0x12 & 1) == 0) {
        local_48 = (double)value;
        dVar9 = dragonbox::to_decimal<double>(local_48);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar9.significand);
        local_68 = dVar9.exponent;
      }
      else {
        local_64 = (float)value;
        dVar5 = dragonbox::to_decimal<float>(local_64);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar5.significand);
        local_68 = dVar5.exponent;
      }
    }
    else {
      local_3c = value;
      local_60.precision = 0x2ff;
      if (precision < 0x2ff) {
        local_60.precision = precision;
      }
      local_60.buf = buf->ptr_;
      local_60.size = 0;
      local_60.exp10 = 0xc;
      local_68 = 1;
      rVar1 = fixed_handler::on_start(&local_60,0x4000000000000,0,10,&local_68);
      if (rVar1 == more) {
        do {
          lVar4 = (long)local_68;
          local_68 = local_68 + -1;
          rVar1 = fixed_handler::on_digit
                            (&local_60,'0',*(long *)(&DAT_00137bc8 + lVar4 * 8) << 0x32,0,1,local_68
                             ,true);
          if (rVar1 != more) goto LAB_001210d9;
        } while (0 < local_68);
        error = 1;
        do {
          error = error * 10;
          local_68 = local_68 + -1;
          rVar1 = fixed_handler::on_digit(&local_60,'0',0x4000000000000,0,error,local_68,false);
        } while (rVar1 == more);
      }
LAB_001210d9:
      if (rVar1 == error) {
        local_68 = local_68 + local_60.size + 0xb;
        fallback_format<long_double>
                  (local_3c,local_60.precision,(bool)((byte)(uVar6 >> 0x12) & 1),buf,&local_68);
      }
      else {
        local_68 = local_68 + local_60.exp10;
        uVar3 = (ulong)(uint)local_60.size;
        if (buf->capacity_ < uVar3) {
          (**buf->_vptr_buffer)(buf,uVar3);
        }
        if (buf->capacity_ < uVar3) {
          uVar3 = buf->capacity_;
        }
        buf->size_ = uVar3;
      }
      if ((uVar6 >> 0x14 & 1) == 0 && uVar7 != 0x200000000) {
        sVar8 = buf->size_;
        if (sVar8 != 0) {
          do {
            iVar2 = local_68 + 1;
            if (buf->ptr_[sVar8 - 1] != '0') goto LAB_001211e9;
            sVar8 = sVar8 - 1;
            local_68 = iVar2;
          } while (sVar8 != 0);
          sVar8 = 0;
        }
LAB_001211e9:
        if (buf->capacity_ < sVar8) {
          (**buf->_vptr_buffer)(buf,sVar8);
        }
        if (buf->capacity_ < sVar8) {
          sVar8 = buf->capacity_;
        }
        buf->size_ = sVar8;
      }
    }
  }
  return local_68;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}